

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris-player.c
# Opt level: O1

gboolean media_player2_player_proxy_get_can_go_next(MediaPlayer2Player *object)

{
  gboolean gVar1;
  GType GVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  
  GVar2 = media_player2_player_proxy_get_type();
  uVar3 = g_type_check_instance_cast(object,GVar2);
  uVar4 = g_dbus_proxy_get_type();
  uVar3 = g_type_check_instance_cast(uVar3,uVar4);
  lVar5 = g_dbus_proxy_get_cached_property(uVar3,"CanGoNext");
  if (lVar5 == 0) {
    gVar1 = 0;
  }
  else {
    gVar1 = g_variant_get_boolean(lVar5);
    g_variant_unref(lVar5);
  }
  return gVar1;
}

Assistant:

static gboolean 
media_player2_player_proxy_get_can_go_next (MediaPlayer2Player *object)
{
  MediaPlayer2PlayerProxy *proxy = MEDIA_PLAYER2_PLAYER_PROXY (object);
  GVariant *variant;
  gboolean value = 0;
  variant = g_dbus_proxy_get_cached_property (G_DBUS_PROXY (proxy), "CanGoNext");
  if (variant != NULL)
    {
      value = g_variant_get_boolean (variant);
      g_variant_unref (variant);
    }
  return value;
}